

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManPrintDistrib(If_DsdMan_t *p)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int CountMarked [17];
  int CountStrNon [17];
  int CountStr [17];
  int CountObjNpn [17];
  int CountObjNon [17];
  int CountObj [17];
  
  CountObj[0xc] = 0;
  CountObj[0xd] = 0;
  CountObj[0xe] = 0;
  CountObj[0xf] = 0;
  CountObj[8] = 0;
  CountObj[9] = 0;
  CountObj[10] = 0;
  CountObj[0xb] = 0;
  CountObj[4] = 0;
  CountObj[5] = 0;
  CountObj[6] = 0;
  CountObj[7] = 0;
  CountObj[0] = 0;
  CountObj[1] = 0;
  CountObj[2] = 0;
  CountObj[3] = 0;
  CountObj[0x10] = 0;
  CountObjNon[0xc] = 0;
  CountObjNon[0xd] = 0;
  CountObjNon[0xe] = 0;
  CountObjNon[0xf] = 0;
  CountObjNon[8] = 0;
  CountObjNon[9] = 0;
  CountObjNon[10] = 0;
  CountObjNon[0xb] = 0;
  CountObjNon[0x10] = 0;
  CountObjNon[4] = 0;
  CountObjNon[5] = 0;
  CountObjNon[6] = 0;
  CountObjNon[7] = 0;
  CountObjNon[0] = 0;
  CountObjNon[1] = 0;
  CountObjNon[2] = 0;
  CountObjNon[3] = 0;
  CountObjNpn[0xc] = 0;
  CountObjNpn[0xd] = 0;
  CountObjNpn[0xe] = 0;
  CountObjNpn[0xf] = 0;
  CountObjNpn[8] = 0;
  CountObjNpn[9] = 0;
  CountObjNpn[10] = 0;
  CountObjNpn[0xb] = 0;
  CountObjNpn[4] = 0;
  CountObjNpn[5] = 0;
  CountObjNpn[6] = 0;
  CountObjNpn[7] = 0;
  CountObjNpn[0x10] = 0;
  CountObjNpn[0] = 0;
  CountObjNpn[1] = 0;
  CountObjNpn[2] = 0;
  CountObjNpn[3] = 0;
  CountStr[0xc] = 0;
  CountStr[0xd] = 0;
  CountStr[0xe] = 0;
  CountStr[0xf] = 0;
  CountStr[8] = 0;
  CountStr[9] = 0;
  CountStr[10] = 0;
  CountStr[0xb] = 0;
  CountStr[4] = 0;
  CountStr[5] = 0;
  CountStr[6] = 0;
  CountStr[7] = 0;
  CountStr[0] = 0;
  CountStr[1] = 0;
  CountStr[2] = 0;
  CountStr[3] = 0;
  CountStr[0x10] = 0;
  CountStrNon[0xc] = 0;
  CountStrNon[0xd] = 0;
  CountStrNon[0xe] = 0;
  CountStrNon[0xf] = 0;
  CountStrNon[8] = 0;
  CountStrNon[9] = 0;
  CountStrNon[10] = 0;
  CountStrNon[0xb] = 0;
  CountStrNon[4] = 0;
  CountStrNon[5] = 0;
  CountStrNon[6] = 0;
  CountStrNon[7] = 0;
  CountStrNon[0] = 0;
  CountStrNon[1] = 0;
  CountStrNon[2] = 0;
  CountStrNon[3] = 0;
  CountStrNon[0x10] = 0;
  CountMarked[0xc] = 0;
  CountMarked[0xd] = 0;
  CountMarked[0xe] = 0;
  CountMarked[0xf] = 0;
  CountMarked[8] = 0;
  CountMarked[9] = 0;
  CountMarked[10] = 0;
  CountMarked[0xb] = 0;
  CountMarked[0x10] = 0;
  CountMarked[4] = 0;
  CountMarked[5] = 0;
  CountMarked[6] = 0;
  CountMarked[7] = 0;
  CountMarked[0] = 0;
  CountMarked[1] = 0;
  CountMarked[2] = 0;
  CountMarked[3] = 0;
  iVar7 = p->nVars;
  for (lVar6 = 0x11; lVar6 + -0xe <= (long)iVar7; lVar6 = lVar6 + 1) {
    iVar3 = p->vTtMem[lVar6 + -0xe]->nEntries;
    CountStr[lVar6 + 6] = iVar3;
    CountObjNpn[(long)iVar7 + 1] = CountObjNpn[(long)iVar7 + 1] + iVar3;
  }
  for (iVar7 = 0; iVar7 < (p->vObjs).nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(&p->vObjs,iVar7);
    uVar9 = *(uint *)((long)pvVar4 + 4);
    CountObj[uVar9 >> 0x1b] = CountObj[uVar9 >> 0x1b] + 1;
    lVar6 = (long)p->nVars;
    CountObj[lVar6 + 1] = CountObj[lVar6 + 1] + 1;
    if ((uVar9 & 7) == 6) {
      CountObjNon[uVar9 >> 0x1b] = CountObjNon[uVar9 >> 0x1b] + 1;
      CountObjNon[lVar6 + 1] = CountObjNon[lVar6 + 1] + 1;
    }
    piVar1 = (int *)((long)CountStr + (ulong)(uVar9 >> 1 & 0x7c));
    *piVar1 = *piVar1 + 1;
    CountStr[lVar6 + 1] = CountStr[lVar6 + 1] + 1;
    iVar3 = If_DsdManCheckNonDec_rec(p,iVar7);
    if (iVar3 != 0) {
      piVar1 = (int *)((long)CountStrNon + (ulong)(*(uint *)((long)pvVar4 + 4) >> 1 & 0x7c));
      *piVar1 = *piVar1 + 1;
      CountStrNon[(long)p->nVars + 1] = CountStrNon[(long)p->nVars + 1] + 1;
    }
    iVar3 = If_DsdVecObjMark(&p->vObjs,iVar7);
    if (iVar3 != 0) {
      piVar1 = (int *)((long)CountMarked + (ulong)(*(uint *)((long)pvVar4 + 4) >> 1 & 0x7c));
      *piVar1 = *piVar1 + 1;
      CountMarked[(long)p->nVars + 1] = CountMarked[(long)p->nVars + 1] + 1;
    }
  }
  puts("***** DSD MANAGER STATISTICS *****");
  printf("Support     ");
  printf("Obj   ");
  printf("ObjNDSD            ");
  printf("NPNNDSD                  ");
  printf("Str   ");
  printf("StrNDSD             ");
  printf("Marked  ");
  putchar(10);
  for (uVar8 = 0; uVar5 = (long)p->nVars + 1, (long)uVar8 <= (long)uVar5; uVar8 = uVar8 + 1) {
    if (uVar8 == (uVar5 & 0xffffffff)) {
      printf("All : ");
    }
    else {
      printf("%3d : ",uVar8 & 0xffffffff);
    }
    uVar9 = CountObj[uVar8];
    printf("%9d ",(ulong)uVar9);
    uVar2 = CountObjNon[uVar8];
    printf("%9d ",(ulong)uVar2);
    if ((int)uVar9 < 2) {
      uVar9 = 1;
    }
    printf("%6.2f %% ",((double)(int)uVar2 * 100.0) / (double)(int)uVar9);
    uVar2 = CountObjNpn[uVar8];
    printf("%9d ",(ulong)uVar2);
    printf("%6.2f %% ",((double)(int)uVar2 * 100.0) / (double)(int)uVar9);
    printf("  ");
    uVar9 = CountStr[uVar8];
    printf("%9d ",(ulong)uVar9);
    uVar2 = CountStrNon[uVar8];
    printf("%9d ",(ulong)uVar2);
    if ((int)uVar9 < 2) {
      uVar9 = 1;
    }
    printf("%6.2f %% ",((double)(int)uVar2 * 100.0) / (double)(int)uVar9);
    uVar2 = CountMarked[uVar8];
    printf("%9d ",(ulong)uVar2);
    printf("%6.2f %%",((double)(int)uVar2 * 100.0) / (double)(int)uVar9);
    putchar(10);
  }
  return;
}

Assistant:

void If_DsdManPrintDistrib( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj; int i;
    int CountObj[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountObjNon[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountObjNpn[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountStr[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountStrNon[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountMarked[IF_MAX_FUNC_LUTSIZE+2] = {0};
    for ( i = 3; i <= p->nVars; i++ )
    {
        CountObjNpn[i] = Vec_MemEntryNum(p->vTtMem[i]);
        CountObjNpn[p->nVars+1] += Vec_MemEntryNum(p->vTtMem[i]);
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        CountObj[If_DsdObjFaninNum(pObj)]++,        CountObj[p->nVars+1]++;
        if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
            CountObjNon[If_DsdObjFaninNum(pObj)]++, CountObjNon[p->nVars+1]++;
        CountStr[If_DsdObjSuppSize(pObj)]++,        CountStr[p->nVars+1]++;
        if ( If_DsdManCheckNonDec_rec(p, i) )
            CountStrNon[If_DsdObjSuppSize(pObj)]++, CountStrNon[p->nVars+1]++;
        if ( If_DsdVecObjMark(&p->vObjs, i) )
            CountMarked[If_DsdObjSuppSize(pObj)]++, CountMarked[p->nVars+1]++;
    }
    printf( "***** DSD MANAGER STATISTICS *****\n" );
    printf( "Support     " );
    printf( "Obj   " );
    printf( "ObjNDSD            " );
    printf( "NPNNDSD                  " );
    printf( "Str   " );
    printf( "StrNDSD             " );
    printf( "Marked  " );
    printf( "\n" );
    for ( i = 0; i <= p->nVars + 1; i++ )
    {
        if ( i == p->nVars + 1 )
            printf( "All : " );
        else
            printf( "%3d : ", i );
        printf( "%9d ", CountObj[i] );
        printf( "%9d ", CountObjNon[i] );
        printf( "%6.2f %% ", 100.0 * CountObjNon[i] / Abc_MaxInt(1, CountObj[i]) );
        printf( "%9d ", CountObjNpn[i] );
        printf( "%6.2f %% ", 100.0 * CountObjNpn[i] / Abc_MaxInt(1, CountObj[i]) );
        printf( "  " );
        printf( "%9d ", CountStr[i] );
        printf( "%9d ", CountStrNon[i] );
        printf( "%6.2f %% ", 100.0 * CountStrNon[i] / Abc_MaxInt(1, CountStr[i]) );
        printf( "%9d ", CountMarked[i] );
        printf( "%6.2f %%",  100.0 * CountMarked[i] / Abc_MaxInt(1, CountStr[i]) );
        printf( "\n" );
    }
}